

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_server.c
# Opt level: O0

void on_bus_acquired(GDBusConnection *conn,gchar *name,gpointer user_data)

{
  undefined8 uVar1;
  ObjectSkeleton *object;
  Greetable *interface_;
  undefined8 uVar2;
  Greetable *greetable;
  ObjectSkeleton *object_skeleton;
  TestingState *ts;
  gpointer user_data_local;
  gchar *name_local;
  GDBusConnection *conn_local;
  
  printf("Acquired bus \"%s\"\n",name);
  uVar1 = g_dbus_object_manager_server_new("/Testing");
  *(undefined8 *)((long)user_data + 8) = uVar1;
  object = object_skeleton_new("/Testing/Greeter");
  interface_ = greetable_skeleton_new();
  *(Greetable **)((long)user_data + 0x10) = interface_;
  object_skeleton_set_greetable(object,interface_);
  g_object_unref(interface_);
  greetable_set_greeting(interface_,"Hello");
  g_signal_connect_data(interface_,"handle-greet",on_handle_greet,user_data,0,0);
  uVar1 = *(undefined8 *)((long)user_data + 8);
  uVar2 = g_dbus_object_skeleton_get_type();
  uVar2 = g_type_check_instance_cast(object,uVar2);
  g_dbus_object_manager_server_export(uVar1,uVar2);
  g_object_unref(object);
  g_dbus_object_manager_server_set_connection(*(undefined8 *)((long)user_data + 8),conn);
  return;
}

Assistant:

static void on_bus_acquired(GDBusConnection *conn, const gchar *name, gpointer user_data)
{
    printf("Acquired bus \"%s\"\n", name);

    struct TestingState *ts = user_data;

    ts->object_manager = g_dbus_object_manager_server_new("/Testing");

    ObjectSkeleton *object_skeleton;
    Greetable *greetable;
    object_skeleton = object_skeleton_new("/Testing/Greeter");
    greetable = greetable_skeleton_new();
    ts->greetable_intf = greetable;
    object_skeleton_set_greetable(object_skeleton, greetable);
    // Release the reference since it's owned by the object now
    g_object_unref(greetable);

    greetable_set_greeting(greetable, "Hello");
    g_signal_connect(greetable, "handle-greet", G_CALLBACK(on_handle_greet), ts);

    // Export the object.  The object manager takes its own reference of the object, so we unref.
    g_dbus_object_manager_server_export(ts->object_manager, G_DBUS_OBJECT_SKELETON(object_skeleton));
    g_object_unref(object_skeleton);


    // Export all objects
    g_dbus_object_manager_server_set_connection(ts->object_manager, conn);
}